

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
jsonnet::internal::LiteralNumber::LiteralNumber(LiteralNumber *this,LiteralNumber *param_1)

{
  AST::AST(&this->super_AST,&param_1->super_AST);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralNumber_0022d040;
  this->value = param_1->value;
  std::__cxx11::string::string((string *)&this->originalString,(string *)&param_1->originalString);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }